

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>::dx
          (FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>
           *this,int i)

{
  long in_RSI;
  value_type *in_RDI;
  value_type *pvVar1;
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  Fad<double> *in_stack_ffffffffffffffd8;
  
  pvVar1 = in_RDI;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>::dx
            ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_> *)in_RDI,
             (int)((ulong)in_RDI >> 0x20));
  FadCst<double>::val((FadCst<double> *)(in_RSI + 8));
  operator/<Fad<double>,_double,_nullptr>
            (in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0);
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  return pvVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}